

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

xmlChar * xmlTextReaderName(xmlTextReaderPtr reader)

{
  xmlNodePtr pxVar1;
  xmlChar *pxVar2;
  _xmlNode *ncname;
  char *cur;
  
  if ((reader == (xmlTextReaderPtr)0x0) || (reader->node == (xmlNodePtr)0x0)) {
    return (xmlChar *)0x0;
  }
  pxVar1 = reader->node;
  if (reader->curnode != (xmlNodePtr)0x0) {
    pxVar1 = reader->curnode;
  }
  pxVar2 = (xmlChar *)0x0;
  switch(pxVar1->type) {
  case XML_ELEMENT_NODE:
  case XML_ATTRIBUTE_NODE:
    if ((pxVar1->ns == (xmlNs *)0x0) || (pxVar2 = pxVar1->ns->prefix, pxVar2 == (xmlChar *)0x0))
    goto switchD_00176b45_caseD_5;
    ncname = (_xmlNode *)pxVar1->name;
    goto LAB_00176bab;
  case XML_TEXT_NODE:
    cur = "#text";
    break;
  case XML_CDATA_SECTION_NODE:
    cur = "#cdata-section";
    break;
  case XML_ENTITY_REF_NODE:
  case XML_ENTITY_NODE:
  case XML_PI_NODE:
  case XML_DOCUMENT_TYPE_NODE:
  case XML_NOTATION_NODE:
  case XML_DTD_NODE:
switchD_00176b45_caseD_5:
    pxVar2 = readerStrdup(reader,pxVar1->name);
    return pxVar2;
  case XML_COMMENT_NODE:
    cur = "#comment";
    break;
  case XML_DOCUMENT_NODE:
  case XML_HTML_DOCUMENT_NODE:
    cur = "#document";
    break;
  case XML_DOCUMENT_FRAG_NODE:
    cur = "#document-fragment";
    break;
  default:
    goto switchD_00176b45_caseD_f;
  case XML_NAMESPACE_DECL:
    ncname = pxVar1->children;
    if (ncname == (_xmlNode *)0x0) {
      cur = "xmlns";
      break;
    }
    pxVar2 = "xmlns";
LAB_00176bab:
    pxVar2 = xmlBuildQName((xmlChar *)ncname,pxVar2,(xmlChar *)0x0,0);
    goto LAB_00176bd4;
  }
  pxVar2 = xmlStrdup((xmlChar *)cur);
LAB_00176bd4:
  if (pxVar2 == (xmlChar *)0x0) {
    xmlTextReaderErrMemory(reader);
  }
switchD_00176b45_caseD_f:
  return pxVar2;
}

Assistant:

xmlChar *
xmlTextReaderName(xmlTextReaderPtr reader) {
    xmlNodePtr node;
    xmlChar *ret;

    if ((reader == NULL) || (reader->node == NULL))
	return(NULL);
    if (reader->curnode != NULL)
	node = reader->curnode;
    else
	node = reader->node;
    switch (node->type) {
        case XML_ELEMENT_NODE:
        case XML_ATTRIBUTE_NODE:
	    if ((node->ns == NULL) ||
		(node->ns->prefix == NULL))
		return(readerStrdup(reader, node->name));

            ret = xmlBuildQName(node->name, node->ns->prefix, NULL, 0);
            if (ret == NULL)
                xmlTextReaderErrMemory(reader);
	    return(ret);
        case XML_TEXT_NODE:
	    return(readerStrdup(reader, BAD_CAST "#text"));
        case XML_CDATA_SECTION_NODE:
	    return(readerStrdup(reader, BAD_CAST "#cdata-section"));
        case XML_ENTITY_NODE:
        case XML_ENTITY_REF_NODE:
	    return(readerStrdup(reader, node->name));
        case XML_PI_NODE:
	    return(readerStrdup(reader, node->name));
        case XML_COMMENT_NODE:
	    return(readerStrdup(reader, BAD_CAST "#comment"));
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
	    return(readerStrdup(reader, BAD_CAST "#document"));
        case XML_DOCUMENT_FRAG_NODE:
	    return(readerStrdup(reader, BAD_CAST "#document-fragment"));
        case XML_NOTATION_NODE:
	    return(readerStrdup(reader, node->name));
        case XML_DOCUMENT_TYPE_NODE:
        case XML_DTD_NODE:
	    return(readerStrdup(reader, node->name));
        case XML_NAMESPACE_DECL: {
	    xmlNsPtr ns = (xmlNsPtr) node;

	    if (ns->prefix == NULL)
		return(readerStrdup(reader, BAD_CAST "xmlns"));
            ret = xmlBuildQName(ns->prefix, BAD_CAST "xmlns", NULL, 0);
            if (ret == NULL)
                xmlTextReaderErrMemory(reader);
	    return(ret);
	}

        case XML_ELEMENT_DECL:
        case XML_ATTRIBUTE_DECL:
        case XML_ENTITY_DECL:
        case XML_XINCLUDE_START:
        case XML_XINCLUDE_END:
	    return(NULL);
    }
    return(NULL);
}